

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Content.cpp
# Opt level: O3

string * __thiscall
ZXing::Content::render_abi_cxx11_(string *__return_storage_ptr__,Content *this,bool withECI)

{
  ulong uVar1;
  byte bVar2;
  bool bVar3;
  pointer pEVar4;
  int iVar5;
  ulong uVar6;
  pointer pEVar7;
  ulong uVar8;
  CharacterSet fallbackCS;
  ECI lastECI;
  CharacterSet local_5e;
  bool local_5d;
  undefined4 local_5c;
  undefined1 local_58 [32];
  Content *local_38;
  
  if (((this->bytes).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start ==
       (this->bytes).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish) || (local_5d = withECI, bVar3 = canProcess(this), !bVar3))
  {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (withECI) {
    SymbologyIdentifier::toString_abi_cxx11_((string *)local_58,&this->symbology,true);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_58);
    if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
      operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
    }
  }
  local_5c = 0xffffffff;
  local_5e = this->defaultCharset;
  bVar2 = this->hasECI;
  if (local_5e == Unknown && (bool)bVar2 == false) {
    local_5e = guessEncoding(this);
    bVar2 = this->hasECI;
  }
  local_58._0_8_ = &local_5e;
  local_58._8_8_ = &local_5d;
  local_58._16_8_ = &local_5c;
  pEVar4 = (this->encodings).
           super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pEVar7 = (this->encodings).
           super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_58._24_8_ = __return_storage_ptr__;
  local_38 = this;
  if (pEVar4 == pEVar7) {
    iVar5 = *(int *)&(this->bytes).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
            *(int *)&(this->bytes).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
  }
  else {
    iVar5 = pEVar4->pos;
    if (iVar5 == 0) goto LAB_00132e84;
  }
  render::anon_class_40_5_a4efd04e::operator()
            ((anon_class_40_5_a4efd04e *)local_58,(bVar2 & 1) + Unknown | ISO8859_1,0,iVar5);
  pEVar4 = (this->encodings).
           super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pEVar7 = (this->encodings).
           super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
           _M_impl.super__Vector_impl_data._M_finish;
LAB_00132e84:
  uVar6 = (ulong)((long)pEVar7 - (long)pEVar4) >> 3;
  if (0 < (int)uVar6) {
    uVar8 = 0;
    do {
      uVar1 = uVar8 + 1;
      if (uVar1 == (uVar6 & 0xffffffff)) {
        iVar5 = *(int *)&(this->bytes).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                *(int *)&(this->bytes).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
      }
      else {
        iVar5 = pEVar4[uVar8 + 1].pos;
      }
      if (pEVar4[uVar8].pos != iVar5) {
        render::anon_class_40_5_a4efd04e::operator()
                  ((anon_class_40_5_a4efd04e *)local_58,pEVar4[uVar8].eci,pEVar4[uVar8].pos,iVar5);
        pEVar4 = (this->encodings).
                 super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pEVar7 = (this->encodings).
                 super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar6 = (ulong)((long)pEVar7 - (long)pEVar4) >> 3;
      uVar8 = uVar1;
    } while ((long)uVar1 < (long)(int)uVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Content::render(bool withECI) const
{
	if (empty() || !canProcess())
		return {};

	std::string res;
	if (withECI)
		res = symbology.toString(true);
	ECI lastECI = ECI::Unknown;
	auto fallbackCS = defaultCharset;
	if (!hasECI && fallbackCS == CharacterSet::Unknown)
		fallbackCS = guessEncoding();

	ForEachECIBlock([&](ECI eci, int begin, int end) {
		// first determine how to decode the content (choose character set)
		//  * eci == ECI::Unknown implies !hasECI and we guess
		//  * if !IsText(eci) the ToCharcterSet(eci) will return Unknown and we decode as binary
		CharacterSet cs = eci == ECI::Unknown ? fallbackCS : ToCharacterSet(eci);

		if (withECI) {
			// then find the eci to report back in the ECI designator
			if (IsText(ToECI(cs))) // everything decoded as text is reported as utf8
				eci = ECI::UTF8;
			else if (eci == ECI::Unknown) // implies !hasECI and fallbackCS is Unknown or Binary
				eci = ECI::Binary;

			if (lastECI != eci)
				res += ToString(eci);
			lastECI = eci;

			std::string tmp;
			TextDecoder::Append(tmp, bytes.data() + begin, end - begin, cs);
			for (auto c : tmp) {
				res += c;
				if (c == '\\') // in the ECI protocol a '\' has to be doubled
					res += c;
			}
		} else {
			TextDecoder::Append(res, bytes.data() + begin, end - begin, cs);
		}
	});

	return res;
}